

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O1

bool __thiscall MemTable::put(MemTable *this,longlong k,string *v)

{
  pointer pcVar1;
  long lVar2;
  bool bVar3;
  time_t tVar4;
  QuadListNode<SSTableDataEntry> *pred_node;
  Result RVar5;
  string local_50;
  
  RVar5 = skipSearch(this,(this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,k);
  pred_node = RVar5.node;
  tVar4 = time((time_t *)0x0);
  if (((undefined1  [16])RVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    pcVar1 = (v->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + v->_M_string_length);
    _put(this,pred_node,k,&local_50,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  lVar2 = (pred_node->data).key;
  if (lVar2 == k) {
    if ((pred_node->data).delete_flag == false) {
      this->_size_bytes = (this->_size_bytes - (pred_node->data).value._M_string_length) - 0x19;
      (pred_node->data).value_length = v->_M_string_length;
      std::__cxx11::string::operator=((string *)&(pred_node->data).value,(string *)v);
      (pred_node->data).timestamp = tVar4;
      this->_size_bytes = (pred_node->data).value._M_string_length + this->_size_bytes + 0x19;
    }
    else {
      if ((lVar2 != k) || ((pred_node->data).delete_flag != true)) goto LAB_00105099;
      this->_size_bytes = (this->_size_bytes - (pred_node->data).value._M_string_length) - 0x19;
      (pred_node->data).value_length = v->_M_string_length;
      std::__cxx11::string::operator=((string *)&(pred_node->data).value,(string *)v);
      (pred_node->data).timestamp = tVar4;
      this->_size_bytes = (pred_node->data).value._M_string_length + this->_size_bytes + 0x19;
      do {
        (pred_node->data).delete_flag = false;
        pred_node = pred_node->above;
      } while (pred_node != (QuadListNode<SSTableDataEntry> *)0x0);
    }
    bVar3 = true;
  }
  else {
LAB_00105099:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool MemTable::put(long long k, std::string v) {
    auto[valid, node]=skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k don't exists. Insert new tower.
        _put(node, k, v, false);
    }
    if (node->data.key == k && !node->data.delete_flag) {
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        return true;
    }
    if (node->data.key == k && node->data.delete_flag) {
        // k found, but marked as deleted
        // update value, timestamp and reset delete_flag.
        _size_bytes -= size_of_node(node);
        node->data.value_length = v.length();
        node->data.value = std::move(v);
        node->data.timestamp = timestamp;
        _size_bytes += size_of_node(node);
        do {
            node->data.delete_flag = false;
            node = node->above;
        } while (node != nullptr);
        return true;
    }
    return false;
}